

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstrlib.cpp
# Opt level: O2

int gmatch(lua_State *L)

{
  luaL_checklstring(L,1,(size_t *)0x0);
  luaL_checklstring(L,2,(size_t *)0x0);
  lua_settop(L,2);
  lua_pushinteger(L,0);
  lua_pushcclosure(L,gmatch_aux,3);
  return 1;
}

Assistant:

static int gmatch (lua_State *L) {
  luaL_checkstring(L, 1);
  luaL_checkstring(L, 2);
  lua_settop(L, 2);
  lua_pushinteger(L, 0);
  lua_pushcclosure(L, gmatch_aux, 3);
  return 1;
}